

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_dht(j_compress_ptr cinfo,int index,boolean is_ac)

{
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int i;
  int length;
  JHUFF_TBL *htbl;
  JPEG_MARKER in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  long local_18;
  int local_c;
  
  if (in_EDX == 0) {
    local_18 = in_RDI[(long)in_ESI + 0x10];
    local_c = in_ESI;
  }
  else {
    local_18 = in_RDI[(long)in_ESI + 0x14];
    local_c = in_ESI + 0x10;
  }
  if (local_18 == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x32;
    *(int *)(*in_RDI + 0x2c) = local_c;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(int *)(local_18 + 0x114) == 0) {
    emit_marker((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffdc);
    iVar2 = 0;
    for (iVar1 = 1; iVar1 < 0x11; iVar1 = iVar1 + 1) {
      iVar2 = (uint)*(byte *)(local_18 + iVar1) + iVar2;
    }
    emit_2bytes((j_compress_ptr)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
    emit_byte((j_compress_ptr)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
    for (iVar1 = 1; iVar1 < 0x11; iVar1 = iVar1 + 1) {
      emit_byte((j_compress_ptr)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
    }
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      emit_byte((j_compress_ptr)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
    }
    *(undefined4 *)(local_18 + 0x114) = 1;
  }
  return;
}

Assistant:

LOCAL(void)
emit_dht(j_compress_ptr cinfo, int index, boolean is_ac)
/* Emit a DHT marker */
{
  JHUFF_TBL *htbl;
  int length, i;

  if (is_ac) {
    htbl = cinfo->ac_huff_tbl_ptrs[index];
    index += 0x10;              /* output index has AC bit set */
  } else {
    htbl = cinfo->dc_huff_tbl_ptrs[index];
  }

  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, index);

  if (!htbl->sent_table) {
    emit_marker(cinfo, M_DHT);

    length = 0;
    for (i = 1; i <= 16; i++)
      length += htbl->bits[i];

    emit_2bytes(cinfo, length + 2 + 1 + 16);
    emit_byte(cinfo, index);

    for (i = 1; i <= 16; i++)
      emit_byte(cinfo, htbl->bits[i]);

    for (i = 0; i < length; i++)
      emit_byte(cinfo, htbl->huffval[i]);

    htbl->sent_table = TRUE;
  }
}